

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

bool __thiscall cfd::core::ByteData256::IsEmpty(ByteData256 *this)

{
  bool bVar1;
  uchar *__s;
  size_type __n;
  undefined1 *__n_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc0;
  undefined1 local_29;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  ByteData256 *this_local;
  
  __n_00 = &local_29;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3e6781);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffffc0,(size_type)__n_00,(allocator_type *)this);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3e679e);
  __s = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3e67ab);
  __n = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_28);
  memset(__s,0,__n);
  bVar1 = ::std::operator==(&this->data_,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->data_);
  return bVar1;
}

Assistant:

bool ByteData256::IsEmpty() const {
  std::vector<uint8_t> data(kByteData256Length);
  memset(data.data(), 0, data.size());
  return data_ == data;
}